

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5StorageDocsize(Fts5Storage *p,i64 iRowid,int *aCol)

{
  int iVar1;
  int iVar2;
  sqlite3_stmt *pStmt;
  int *in_RDX;
  sqlite3_stmt *in_RDI;
  long in_FS_OFFSET;
  int nBlob;
  Fts5Storage *unaff_retaddr;
  u8 *aBlob;
  int bCorrupt;
  int rc;
  int nCol;
  sqlite3_stmt *pLookup;
  int in_stack_ffffffffffffffbc;
  sqlite3_stmt *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  int nCol_00;
  long lVar4;
  long lVar5;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  nCol_00 = *(int *)(*(char **)in_RDI + 0x20);
  lVar4 = 0;
  iVar1 = fts5StorageGetStmt(unaff_retaddr,(int)((ulong)lVar5 >> 0x20),(sqlite3_stmt **)0x0,
                             (char **)in_RDI);
  if (lVar4 != 0) {
    iVar3 = 1;
    sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(nCol_00,iVar1),1,
                       (sqlite_int64)in_stack_ffffffffffffffc0);
    iVar2 = sqlite3_step(in_RDI);
    if (iVar2 == 100) {
      pStmt = (sqlite3_stmt *)
              sqlite3_column_blob(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      sqlite3_column_bytes(pStmt,in_stack_ffffffffffffffbc);
      iVar2 = fts5StorageDecodeSizeArray
                        (in_RDX,nCol_00,(u8 *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
                         (int)((ulong)pStmt >> 0x20));
      if (iVar2 == 0) {
        iVar3 = 0;
      }
    }
    iVar1 = sqlite3_reset((sqlite3_stmt *)CONCAT44(nCol_00,iVar1));
    if ((iVar3 != 0) && (iVar1 == 0)) {
      iVar1 = 0x10b;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5StorageDocsize(Fts5Storage *p, i64 iRowid, int *aCol){
  int nCol = p->pConfig->nCol;    /* Number of user columns in table */
  sqlite3_stmt *pLookup = 0;      /* Statement to query %_docsize */
  int rc;                         /* Return Code */

  assert( p->pConfig->bColumnsize );
  rc = fts5StorageGetStmt(p, FTS5_STMT_LOOKUP_DOCSIZE, &pLookup, 0);
  if( pLookup ){
    int bCorrupt = 1;
    assert( rc==SQLITE_OK );
    sqlite3_bind_int64(pLookup, 1, iRowid);
    if( SQLITE_ROW==sqlite3_step(pLookup) ){
      const u8 *aBlob = sqlite3_column_blob(pLookup, 0);
      int nBlob = sqlite3_column_bytes(pLookup, 0);
      if( 0==fts5StorageDecodeSizeArray(aCol, nCol, aBlob, nBlob) ){
        bCorrupt = 0;
      }
    }
    rc = sqlite3_reset(pLookup);
    if( bCorrupt && rc==SQLITE_OK ){
      rc = FTS5_CORRUPT;
    }
  }else{
    assert( rc!=SQLITE_OK );
  }

  return rc;
}